

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O3

void icetDataReplicationGroup(IceTInt size,IceTInt *processes)

{
  ulong uVar1;
  IceTInt rank;
  int local_20;
  IceTInt local_1c;
  
  local_1c = size;
  icetGetIntegerv(2,&local_20);
  if (0 < size) {
    uVar1 = 0;
    do {
      if (processes[uVar1] == local_20) {
        icetStateSetIntegerv(0x2d,1,&local_1c);
        icetStateSetIntegerv(0x2c,local_1c,processes);
        return;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  icetRaiseDiagnostic("Local process not part of data replication group.",0xfffffffa,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                      ,0x7e);
  return;
}

Assistant:

void icetDataReplicationGroup(IceTInt size, const IceTInt *processes)
{
    IceTInt rank;
    IceTBoolean found_myself = ICET_FALSE;
    IceTInt i;

    icetGetIntegerv(ICET_RANK, &rank);
    for (i = 0; i < size; i++) {
        if (processes[i] == rank) {
            found_myself = ICET_TRUE;
            break;
        }
    }

    if (!found_myself) {
        icetRaiseError("Local process not part of data replication group.",
                       ICET_INVALID_VALUE);
        return;
    }

    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP_SIZE, 1, &size);
    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP, size, processes);
}